

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver_api.c
# Opt level: O0

int satoko_solve_assumptions(solver_t *s,int *plits,int nlits)

{
  int iVar1;
  int local_20;
  int status;
  int i;
  int nlits_local;
  int *plits_local;
  solver_t *s_local;
  
  for (local_20 = 0; local_20 < nlits; local_20 = local_20 + 1) {
    satoko_assump_push(s,plits[local_20]);
  }
  iVar1 = satoko_solve(s);
  for (local_20 = 0; local_20 < nlits; local_20 = local_20 + 1) {
    satoko_assump_pop(s);
  }
  return iVar1;
}

Assistant:

int satoko_solve_assumptions(solver_t *s, int * plits, int nlits)
{
    int i, status;
    // printf("\n[Satoko] Solve with assumptions.. (%d)\n", vec_uint_size(s->assumptions));
    // printf("[Satoko]   + Variables: %d\n", satoko_varnum(s));
    // printf("[Satoko]   + Clauses: %d\n", satoko_clausenum(s));
    // printf("[Satoko]   + Trail size: %d\n", vec_uint_size(s->trail));
    // printf("[Satoko]   + Queue head: %d\n", s->i_qhead);
    // solver_debug_check_trail(s);
    for ( i = 0; i < nlits; i++ )
        satoko_assump_push( s, plits[i] );
    status = satoko_solve( s );
    for ( i = 0; i < nlits; i++ )
        satoko_assump_pop( s );
    return status;
}